

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

string * format<int,char*>(string *__return_storage_ptr__,int fmt_num,string *fmt,int arg,char *args
                          )

{
  string fmt_replaced;
  string local_40;
  
  format<int>(&local_40,fmt_num,fmt,arg);
  format<char*>(__return_storage_ptr__,fmt_num + 1,&local_40,args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string format (int fmt_num, const std::string& fmt, T arg, Args... args)
{
    const std::string fmt_replaced (format (fmt_num, fmt, arg));
    return format (fmt_num+1, fmt_replaced, args...);
}